

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  int64_t iVar3;
  int64_t iVar4;
  const_reference pvVar5;
  reference pvVar6;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  uint in_XMM0_Da;
  int64_t i;
  size_type local_20;
  
  iVar3 = size((Vector *)0x194423);
  iVar4 = size((Vector *)0x194432);
  if (iVar3 == iVar4) {
    local_20 = 0;
    while( true ) {
      iVar3 = size((Vector *)0x19447d);
      if (iVar3 <= (long)local_20) break;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,local_20);
      vVar1 = *pvVar5;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_20);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)vVar1),ZEXT416(in_XMM0_Da),ZEXT416((uint)*pvVar6));
      *pvVar6 = auVar2._0_4_;
      local_20 = local_20 + 1;
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/vector.cc"
                ,0x31,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}